

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.hpp
# Opt level: O2

void __thiscall
asio::ssl::detail::
io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>
::operator()(io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>
             *this,error_code ec,size_t bytes_transferred,int start)

{
  stream_core *psVar1;
  basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *s;
  want wVar2;
  error_code *__args;
  ulong uVar3;
  steady_timer *this_00;
  basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
  *this_01;
  basic_stream_socket<asio::ip::tcp,asio::any_io_executor> *this_02;
  size_t sVar4;
  const_buffer cVar5;
  mutable_buffer local_48;
  error_category *local_38;
  
  local_38 = ec._M_cat;
  this->start_ = start;
  sVar4 = bytes_transferred;
  if (start != 1) goto LAB_001cf580;
  do {
    wVar2 = handshake_op::operator()
                      (&this->op_,&this->core_->engine_,&this->ec_,&this->bytes_transferred_);
    this->want_ = wVar2;
    if (wVar2 == want_input_and_retry) {
      psVar1 = this->core_;
      if ((psVar1->input_).size_ == 0) {
        this_01 = (basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
                   *)&psVar1->pending_read_;
        if ((psVar1->pending_read_).impl_.implementation_.expiry.__d.__r == -0x8000000000000000) {
          local_48.data_ = (void *)0x7fffffffffffffff;
          basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
          ::expires_at((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                        *)this_01,(time_point *)&local_48);
          this_02 = (basic_stream_socket<asio::ip::tcp,asio::any_io_executor> *)this->next_layer_;
          local_48 = this->core_->input_buffer_;
          goto LAB_001cf75c;
        }
        goto LAB_001cf739;
      }
      cVar5 = engine::put_input(&psVar1->engine_,&psVar1->input_);
      this->core_->input_ = cVar5;
    }
    else {
      if ((wVar2 == want_output_and_retry) || (wVar2 == want_output)) {
        this_01 = (basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
                   *)&this->core_->pending_write_;
        if ((this->core_->pending_write_).impl_.implementation_.expiry.__d.__r ==
            -0x8000000000000000) {
          local_48.data_ = (void *)0x7fffffffffffffff;
          basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
          ::expires_at((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                        *)this_01,(time_point *)&local_48);
          s = this->next_layer_;
          local_48 = engine::get_output(&this->core_->engine_,&this->core_->output_buffer_);
          async_write<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>>
                    (s,&local_48,this,0);
          return;
        }
LAB_001cf739:
        basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
        ::
        async_wait<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>>
                  (this_01,this);
        return;
      }
      sVar4 = bytes_transferred;
      if (start != 0) {
        this_02 = (basic_stream_socket<asio::ip::tcp,asio::any_io_executor> *)this->next_layer_;
        local_48.size_ = 0;
        local_48.data_ = (this->core_->input_buffer_).data_;
LAB_001cf75c:
        basic_stream_socket<asio::ip::tcp,asio::any_io_executor>::
        async_read_some<asio::mutable_buffers_1,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>>
                  (this_02,(mutable_buffers_1 *)&local_48,this);
        return;
      }
LAB_001cf580:
      bytes_transferred = 0;
      if ((sVar4 != 0xffffffffffffffff) && (bytes_transferred = sVar4, (this->ec_)._M_value == 0)) {
        (this->ec_)._M_value = ec._M_value;
        (this->ec_)._M_cat = local_38;
      }
      wVar2 = this->want_;
      if (wVar2 == want_input_and_retry) {
        psVar1 = this->core_;
        uVar3 = (psVar1->input_buffer_).size_;
        if (bytes_transferred <= uVar3) {
          uVar3 = bytes_transferred;
        }
        (psVar1->input_).data_ = (psVar1->input_buffer_).data_;
        (psVar1->input_).size_ = uVar3;
        cVar5 = engine::put_input(&this->core_->engine_,&this->core_->input_);
        this->core_->input_ = cVar5;
        this_00 = &this->core_->pending_read_;
      }
      else {
        if (wVar2 != want_output_and_retry) {
          if (wVar2 == want_output) {
            local_48.data_ = (void *)0x8000000000000000;
            basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
            ::expires_at(&this->core_->pending_write_,(time_point *)&local_48);
          }
          __args = engine::map_error_code(&this->core_->engine_,&this->ec_);
          goto LAB_001cf6fd;
        }
        this_00 = &this->core_->pending_write_;
      }
      local_48.data_ = (void *)0x8000000000000000;
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
      ::expires_at(this_00,(time_point *)&local_48);
    }
  } while ((this->ec_)._M_value == 0);
  __args = engine::map_error_code(&this->core_->engine_,&this->ec_);
LAB_001cf6fd:
  std::
  _Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>
  ::operator()((_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>
                *)&this->handler_,__args);
  return;
}

Assistant:

void operator()(asio::error_code ec,
      std::size_t bytes_transferred = ~std::size_t(0), int start = 0)
  {
    switch (start_ = start)
    {
    case 1: // Called after at least one async operation.
      do
      {
        switch (want_ = op_(core_.engine_, ec_, bytes_transferred_))
        {
        case engine::want_input_and_retry:

          // If the input buffer already has data in it we can pass it to the
          // engine and then retry the operation immediately.
          if (core_.input_.size() != 0)
          {
            core_.input_ = core_.engine_.put_input(core_.input_);
            continue;
          }

          // The engine wants more data to be read from input. However, we
          // cannot allow more than one read operation at a time on the
          // underlying transport. The pending_read_ timer's expiry is set to
          // pos_infin if a read is in progress, and neg_infin otherwise.
          if (core_.expiry(core_.pending_read_) == core_.neg_infin())
          {
            // Prevent other read operations from being started.
            core_.pending_read_.expires_at(core_.pos_infin());

            ASIO_HANDLER_LOCATION((
                  __FILE__, __LINE__, Operation::tracking_name()));

            // Start reading some data from the underlying transport.
            next_layer_.async_read_some(
                asio::buffer(core_.input_buffer_),
                ASIO_MOVE_CAST(io_op)(*this));
          }
          else
          {
            ASIO_HANDLER_LOCATION((
                  __FILE__, __LINE__, Operation::tracking_name()));

            // Wait until the current read operation completes.
            core_.pending_read_.async_wait(ASIO_MOVE_CAST(io_op)(*this));
          }

          // Yield control until asynchronous operation completes. Control
          // resumes at the "default:" label below.
          return;

        case engine::want_output_and_retry:
        case engine::want_output:

          // The engine wants some data to be written to the output. However, we
          // cannot allow more than one write operation at a time on the
          // underlying transport. The pending_write_ timer's expiry is set to
          // pos_infin if a write is in progress, and neg_infin otherwise.
          if (core_.expiry(core_.pending_write_) == core_.neg_infin())
          {
            // Prevent other write operations from being started.
            core_.pending_write_.expires_at(core_.pos_infin());

            ASIO_HANDLER_LOCATION((
                  __FILE__, __LINE__, Operation::tracking_name()));

            // Start writing all the data to the underlying transport.
            asio::async_write(next_layer_,
                core_.engine_.get_output(core_.output_buffer_),
                ASIO_MOVE_CAST(io_op)(*this));
          }
          else
          {
            ASIO_HANDLER_LOCATION((
                  __FILE__, __LINE__, Operation::tracking_name()));

            // Wait until the current write operation completes.
            core_.pending_write_.async_wait(ASIO_MOVE_CAST(io_op)(*this));
          }

          // Yield control until asynchronous operation completes. Control
          // resumes at the "default:" label below.
          return;

        default:

          // The SSL operation is done and we can invoke the handler, but we
          // have to keep in mind that this function might be being called from
          // the async operation's initiating function. In this case we're not
          // allowed to call the handler directly. Instead, issue a zero-sized
          // read so the handler runs "as-if" posted using io_context::post().
          if (start)
          {
            ASIO_HANDLER_LOCATION((
                  __FILE__, __LINE__, Operation::tracking_name()));

            next_layer_.async_read_some(
                asio::buffer(core_.input_buffer_, 0),
                ASIO_MOVE_CAST(io_op)(*this));

            // Yield control until asynchronous operation completes. Control
            // resumes at the "default:" label below.
            return;
          }
          else
          {
            // Continue on to run handler directly.
            break;
          }
        }

        default:
        if (bytes_transferred == ~std::size_t(0))
          bytes_transferred = 0; // Timer cancellation, no data transferred.
        else if (!ec_)
          ec_ = ec;

        switch (want_)
        {
        case engine::want_input_and_retry:

          // Add received data to the engine's input.
          core_.input_ = asio::buffer(
              core_.input_buffer_, bytes_transferred);
          core_.input_ = core_.engine_.put_input(core_.input_);

          // Release any waiting read operations.
          core_.pending_read_.expires_at(core_.neg_infin());

          // Check for cancellation before continuing.
          if (this->cancelled() != cancellation_type::none)
          {
            ec_ = asio::error::operation_aborted;
            break;
          }

          // Try the operation again.
          continue;

        case engine::want_output_and_retry:

          // Release any waiting write operations.
          core_.pending_write_.expires_at(core_.neg_infin());

          // Check for cancellation before continuing.
          if (this->cancelled() != cancellation_type::none)
          {
            ec_ = asio::error::operation_aborted;
            break;
          }

          // Try the operation again.
          continue;

        case engine::want_output:

          // Release any waiting write operations.
          core_.pending_write_.expires_at(core_.neg_infin());

          // Fall through to call handler.

        default:

          // Pass the result to the handler.
          op_.call_handler(handler_,
              core_.engine_.map_error_code(ec_),
              ec_ ? 0 : bytes_transferred_);

          // Our work here is done.
          return;
        }
      } while (!ec_);

      // Operation failed. Pass the result to the handler.
      op_.call_handler(handler_, core_.engine_.map_error_code(ec_), 0);
    }
  }